

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void __thiscall
ArenaVector<SQInstruction>::_realloc(ArenaVector<SQInstruction> *this,size_type_conflict newsize)

{
  uint8_t *__dest;
  int in_ESI;
  size_t in_RDI;
  SQInstruction *newPtr;
  undefined4 local_24;
  Arena *in_stack_ffffffffffffffe8;
  
  local_24 = in_ESI;
  if (in_ESI == 0) {
    local_24 = 4;
  }
  __dest = Arena::allocate(in_stack_ffffffffffffffe8,in_RDI);
  memcpy(__dest,*(void **)(in_RDI + 8),(ulong)*(uint *)(in_RDI + 0x10) << 3);
  *(uint8_t **)(in_RDI + 8) = __dest;
  *(int *)(in_RDI + 0x14) = local_24;
  return;
}

Assistant:

void _realloc(size_type newsize)
    {
        newsize = (newsize > 0) ? newsize : 4;
        T *newPtr = (T *)_arena->allocate(newsize * sizeof(T));
        memcpy(newPtr, _vals, _size * sizeof(T));
        _vals = newPtr;
        _allocated = newsize;
    }